

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfile.cpp
# Opt level: O2

bool __thiscall QFile::moveToTrash(QFile *this)

{
  long lVar1;
  QFileDevicePrivate *this_00;
  char cVar2;
  bool bVar3;
  int iVar4;
  FileError FVar5;
  undefined4 extraout_var;
  bool bVar6;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_c8;
  QSystemError local_b0;
  QFileSystemEntry trashEntry;
  QFileSystemEntry fileEntry;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QFileDevicePrivate *)(this->super_QFileDevice).super_QIODevice.super_QObject.d_ptr.d;
  if (this_00[1].super_QIODevicePrivate.super_QObjectPrivate.super_QObjectData.parent ==
      (QObject *)0x0) {
    iVar4 = (*(this_00->super_QIODevicePrivate).super_QObjectPrivate.super_QObjectData.
              _vptr_QObjectData[7])(this_00);
    cVar2 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar4) + 0x140))
                      ((long *)CONCAT44(extraout_var,iVar4));
    if (cVar2 == '\0') {
      fileEntry.m_filePath.d.d._0_4_ = 2;
      fileEntry.m_filePath.d.size._4_4_ = 0;
      fileEntry.m_filePath.d.d._4_4_ = 0;
      fileEntry.m_filePath.d.ptr._0_4_ = 0;
      fileEntry.m_filePath.d.ptr._4_4_ = 0;
      fileEntry.m_filePath.d.size._0_4_ = 0;
      fileEntry.m_nativeFilePath.d.d = (Data *)anon_var_dwarf_1ca02;
      bVar6 = false;
      QMessageLogger::warning((QMessageLogger *)&fileEntry,"QFile::remove: Empty or null file name")
      ;
      goto LAB_0021e77e;
    }
  }
  QFileDevice::unsetError(&this->super_QFileDevice);
  (*(this->super_QFileDevice).super_QIODevice.super_QObject._vptr_QObject[0xe])(this);
  FVar5 = QFileDevice::error(&this->super_QFileDevice);
  if (FVar5 == NoError) {
    fileEntry._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
    fileEntry.m_nativeFilePath.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
    fileEntry.m_nativeFilePath.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    fileEntry.m_filePath.d.size._0_4_ = 0xaaaaaaaa;
    fileEntry.m_filePath.d.size._4_4_ = 0xaaaaaaaa;
    fileEntry.m_nativeFilePath.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    fileEntry.m_filePath.d.d._0_4_ = 0xaaaaaaaa;
    fileEntry.m_filePath.d.d._4_4_ = 0xaaaaaaaa;
    fileEntry.m_filePath.d.ptr._0_4_ = 0xaaaaaaaa;
    fileEntry.m_filePath.d.ptr._4_4_ = 0xaaaaaaaa;
    QFileSystemEntry::QFileSystemEntry(&fileEntry,(QString *)(this_00 + 1));
    trashEntry._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
    trashEntry.m_nativeFilePath.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
    trashEntry.m_nativeFilePath.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    trashEntry.m_filePath.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    trashEntry.m_nativeFilePath.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    trashEntry.m_filePath.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    trashEntry.m_filePath.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QFileSystemEntry::QFileSystemEntry(&trashEntry);
    local_b0.errorCode = 0;
    local_b0.errorScope = NoError;
    bVar3 = QFileSystemEngine::moveFileToTrash(&fileEntry,&trashEntry,&local_b0);
    if (bVar3) {
      QFileSystemEntry::filePath((QString *)&QStack_c8,&trashEntry);
      setFileName(this,(QString *)&QStack_c8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_c8);
      QFileDevice::unsetError(&this->super_QFileDevice);
    }
    else {
      QSystemError::toString((QString *)&QStack_c8,&local_b0);
      QFileDevicePrivate::setError(this_00,RenameError,(QString *)&QStack_c8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_c8);
    }
    QFileSystemEntry::~QFileSystemEntry(&trashEntry);
    QFileSystemEntry::~QFileSystemEntry(&fileEntry);
    bVar6 = true;
    if (bVar3) goto LAB_0021e77e;
  }
  bVar6 = false;
LAB_0021e77e:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar6;
  }
  __stack_chk_fail();
}

Assistant:

bool
QFile::moveToTrash()
{
    Q_D(QFile);
    if (d->fileName.isEmpty() &&
        !static_cast<QFSFileEngine *>(d->engine())->isUnnamedFile()) {
        qWarning("QFile::remove: Empty or null file name");
        return false;
    }
    unsetError();
    close();
    if (error() == QFile::NoError) {
        QFileSystemEntry fileEntry(d->fileName);
        QFileSystemEntry trashEntry;
        QSystemError error;
        if (QFileSystemEngine::moveFileToTrash(fileEntry, trashEntry, error)) {
            setFileName(trashEntry.filePath());
            unsetError();
            return true;
        }
        d->setError(QFile::RenameError, error.toString());
    }
    return false;
}